

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

byte_vec_t * __thiscall
sfc::Map::snes_mode7_interleaved_data(byte_vec_t *__return_storage_ptr__,Map *this,Tileset *tileset)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  size_type local_98;
  uint local_74;
  uint local_70;
  uint i_1;
  uint i;
  size_t sz;
  undefined1 local_50 [8];
  byte_vec_t tile_data;
  byte_vec_t map_data;
  Tileset *tileset_local;
  Map *this_local;
  byte_vec_t *data;
  
  native_data((byte_vec_t *)
              &tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,this,false,0,0);
  Tileset::native_data((byte_vec_t *)local_50,tileset);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 < sVar2) {
    local_98 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  else {
    local_98 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &tile_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  }
  _i = local_98;
  i_1._3_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i_1 + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,local_98 * 2,(allocator<unsigned_char> *)((long)&i_1 + 2));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i_1 + 2));
  for (local_70 = 0;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &tile_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), local_70 < sVar2;
      local_70 = local_70 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_70);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,(ulong)(local_70 << 1));
    *pvVar4 = vVar1;
  }
  for (local_74 = 0;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50),
      local_74 < sVar2; local_74 = local_74 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        (ulong)local_74);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,(ulong)(local_74 * 2 + 1));
    *pvVar4 = vVar1;
  }
  i_1._3_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

byte_vec_t Map::snes_mode7_interleaved_data(const Tileset& tileset) const {
  auto map_data = native_data();
  auto tile_data = tileset.native_data();

  size_t sz = (tile_data.size() > map_data.size()) ? tile_data.size() : map_data.size();
  byte_vec_t data = byte_vec_t(sz * 2);
  for (unsigned i = 0; i < map_data.size(); ++i)
    data[(i << 1)] = map_data[i];
  for (unsigned i = 0; i < tile_data.size(); ++i)
    data[(i << 1) + 1] = tile_data[i];

  return data;
}